

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O3

REF_STATUS ref_part_by_extension(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_SIZE *data;
  int *piVar1;
  REF_INT RVar2;
  REF_GRID pRVar3;
  REF_NODE pRVar4;
  REF_GEOM pRVar5;
  REF_CELL pRVar6;
  REF_INT *pRVar7;
  size_t sVar8;
  int iVar9;
  uint uVar10;
  REF_STATUS RVar11;
  size_t sVar12;
  FILE *pFVar13;
  REF_BYTE *pRVar14;
  __off_t conn_offset;
  REF_MPI pRVar15;
  int iVar16;
  undefined8 uVar17;
  char *pcVar18;
  ulong uVar19;
  size_t __size;
  REF_MPI pRVar20;
  long lVar21;
  double dVar22;
  char letter;
  REF_BOOL available;
  REF_INT version;
  REF_INT dim_1;
  REF_INT dim;
  char units [3];
  int nqua2;
  int nqua;
  int ntri2;
  int ntri_int;
  int npyr;
  int npri;
  int nhex;
  int ntet_int;
  int boundary_patches;
  int cell_polynomial_order;
  int face_polynomial_order;
  int max_faces_per_cell;
  int max_nodes_per_cell;
  int max_nodes_per_face;
  int ncells;
  int nfaces;
  int nnodes;
  int refined;
  REF_INT keyword_code;
  int precision;
  int meshes;
  int revision;
  int magic;
  REF_FILEPOS next_position;
  char patch_type [17];
  char coordinate_system [7];
  REF_LONG ncell;
  double model_scale;
  REF_LONG nnode;
  REF_FILEPOS key_pos [156];
  char local_669;
  REF_MPI local_668;
  REF_MPI local_660;
  long local_658;
  REF_GEOM local_650;
  uint local_644;
  REF_NODE local_640;
  uint local_634;
  REF_MPI local_630;
  int local_624;
  char local_61f [2];
  undefined1 local_61d;
  uint local_61c;
  uint local_618;
  uint local_614;
  uint local_610;
  int local_60c;
  undefined4 local_608;
  int local_604;
  uint local_600;
  int local_5fc;
  undefined4 local_5f8;
  undefined4 local_5f4;
  uint local_5f0;
  uint local_5ec;
  uint local_5e8;
  uint local_5e4;
  uint local_5e0;
  uint local_5dc;
  uint local_5d8;
  uint local_5d4;
  REF_INT local_5d0;
  undefined1 local_5c9;
  uint local_5c8;
  uint local_5c4;
  uint local_5c0;
  uint local_5bc;
  size_t local_5b8 [4];
  undefined1 local_598;
  REF_LONG local_588 [2];
  undefined1 local_578;
  char local_56f [6];
  undefined1 local_569;
  REF_LONG local_568 [3];
  REF_MPI local_550;
  REF_LONG local_548 [4];
  undefined1 local_528;
  REF_DBL local_518 [157];
  
  sVar12 = strlen(filename);
  if (sVar12 < 0xb) {
    if (sVar12 != 10) {
      if (6 < sVar12) goto LAB_0016ebd7;
      if (4 < sVar12) goto LAB_0016ecaa;
LAB_0016ecc2:
      printf("%s: %d: %s %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xd0c,
             "input file name extension unknown",filename);
      pcVar18 = "unknown file extension";
      uVar10 = 1;
      uVar17 = 0xd0e;
      uVar19 = 1;
      goto LAB_0016f3c7;
    }
    iVar9 = strcmp(filename + 1,".b8.ugrid");
    if (iVar9 == 0) goto LAB_0016eb85;
LAB_0016ebd7:
    iVar9 = strcmp(filename + (sVar12 - 6),".meshb");
    if (iVar9 != 0) {
LAB_0016ecaa:
      iVar9 = strcmp(filename + (sVar12 - 4),".avm");
      if (iVar9 != 0) goto LAB_0016ecc2;
      uVar10 = ref_grid_create(ref_grid_ptr,ref_mpi);
      if (uVar10 == 0) {
        pRVar3 = *ref_grid_ptr;
        pRVar4 = pRVar3->node;
        if (ref_mpi->id != 0) {
          pFVar13 = (FILE *)0x0;
          lVar21 = local_658;
LAB_0016eed6:
          local_658 = lVar21;
          uVar10 = ref_mpi_bcast(pRVar3->mpi,&local_634,1,1);
          if (uVar10 == 0) {
            pRVar3->twod = (uint)(local_634 == 2);
            uVar10 = ref_mpi_bcast(pRVar3->mpi,&pRVar3->coordinate_system,1,1);
            if (uVar10 == 0) {
              uVar10 = ref_mpi_bcast(pRVar3->mpi,&pRVar3->unit,1,1);
              if (uVar10 == 0) {
                uVar10 = ref_mpi_bcast(pRVar3->mpi,pRVar3->references,7,3);
                if (uVar10 == 0) {
                  uVar10 = ref_mpi_bcast(pRVar3->mpi,&local_658,1,2);
                  if (uVar10 == 0) {
                    uVar10 = ref_mpi_bcast(pRVar3->mpi,&local_660,1,2);
                    if (uVar10 == 0) {
                      uVar10 = ref_mpi_bcast(pRVar3->mpi,&local_630,1,2);
                      if (uVar10 == 0) {
                        uVar10 = ref_part_node((FILE *)pFVar13,0,0,0,pRVar4,local_658);
                        if (uVar10 == 0) {
                          if (pRVar3->twod == 0) {
                            pRVar6 = pRVar3->cell[3];
                            uVar10 = ref_part_meshb_cell(pRVar6,(REF_LONG)local_660,pRVar4,local_658
                                                         ,0,0,(FILE *)pFVar13);
                            if (uVar10 == 0) {
                              iVar9 = pRVar6->max;
                              if (0 < iVar9) {
                                pRVar7 = pRVar6->c2n;
                                iVar16 = 0;
                                do {
                                  lVar21 = (long)iVar16 * (long)pRVar6->size_per;
                                  if (pRVar7[lVar21] != -1) {
                                    piVar1 = pRVar7 + (long)(int)lVar21 + (long)pRVar6->node_per;
                                    *piVar1 = -*piVar1;
                                    iVar9 = pRVar6->max;
                                  }
                                  iVar16 = iVar16 + 1;
                                } while (iVar16 < iVar9);
                              }
                              goto LAB_00170254;
                            }
                            pcVar18 = "read tri";
                            uVar17 = 0x6e9;
                          }
                          else {
                            pRVar6 = pRVar3->cell[0];
                            uVar10 = ref_part_meshb_cell(pRVar6,(REF_LONG)local_660,pRVar4,local_658
                                                         ,0,1,(FILE *)pFVar13);
                            if (uVar10 == 0) {
                              iVar9 = pRVar6->max;
                              if (0 < iVar9) {
                                pRVar7 = pRVar6->c2n;
                                iVar16 = 0;
                                do {
                                  lVar21 = (long)iVar16 * (long)pRVar6->size_per;
                                  if (pRVar7[lVar21] != -1) {
                                    piVar1 = pRVar7 + (long)(int)lVar21 + (long)pRVar6->node_per;
                                    *piVar1 = -*piVar1;
                                    iVar9 = pRVar6->max;
                                  }
                                  iVar16 = iVar16 + 1;
                                } while (iVar16 < iVar9);
                              }
LAB_00170254:
                              if (pRVar3->twod == 0) {
                                if (pRVar3->mpi->id == 0) {
                                  conn_offset = ftello(pFVar13);
                                }
                                else {
                                  conn_offset = 0;
                                }
                                uVar10 = ref_part_bin_ugrid_cell
                                                   (pRVar3->cell[8],(REF_LONG)local_630,pRVar4,
                                                    local_658,(FILE *)pFVar13,conn_offset,0,0,0);
                                if (uVar10 == 0) goto LAB_001704bb;
                                pcVar18 = "read tet";
                                uVar17 = 0x709;
                              }
                              else {
                                pRVar6 = pRVar3->cell[3];
                                uVar10 = ref_part_meshb_cell(pRVar6,(REF_LONG)local_630,pRVar4,
                                                             local_658,0,0,(FILE *)pFVar13);
                                if (uVar10 == 0) {
                                  iVar9 = pRVar6->max;
                                  if (0 < iVar9) {
                                    pRVar7 = pRVar6->c2n;
                                    iVar16 = 0;
                                    do {
                                      lVar21 = (long)pRVar6->size_per * (long)iVar16;
                                      if (pRVar7[lVar21] != -1) {
                                        RVar2 = pRVar7[lVar21 + 2];
                                        pRVar7[lVar21 + 2] = pRVar7[lVar21 + 1];
                                        pRVar7[(long)pRVar6->size_per * (long)iVar16 + 1] = RVar2;
                                        iVar9 = pRVar6->max;
                                      }
                                      iVar16 = iVar16 + 1;
                                    } while (iVar16 < iVar9);
                                  }
LAB_001704bb:
                                  if (pRVar3->mpi->id != 0) {
                                    return 0;
                                  }
                                  iVar9 = fclose(pFVar13);
                                  if (iVar9 == 0) {
                                    return 0;
                                  }
                                  pRVar15 = (REF_MPI)(long)iVar9;
                                  pcVar18 = "close file";
                                  uVar17 = 0x70c;
LAB_001704fe:
                                  pRVar20 = (REF_MPI)0x0;
                                  goto LAB_00170048;
                                }
                                pcVar18 = "read tri";
                                uVar17 = 0x6f8;
                              }
                            }
                            else {
                              pcVar18 = "read edg as tri";
                              uVar17 = 0x6dc;
                            }
                          }
                        }
                        else {
                          pcVar18 = "part node";
                          uVar17 = 0x6d2;
                        }
                      }
                      else {
                        pcVar18 = "bcast";
                        uVar17 = 0x6cb;
                      }
                    }
                    else {
                      pcVar18 = "bcast";
                      uVar17 = 0x6ca;
                    }
                  }
                  else {
                    pcVar18 = "bcast";
                    uVar17 = 0x6c9;
                  }
                }
                else {
                  pcVar18 = "reference";
                  uVar17 = 0x6c7;
                }
              }
              else {
                pcVar18 = "unit";
                uVar17 = 0x6c4;
              }
            }
            else {
              pcVar18 = "coordinate_system";
              uVar17 = 0x6c1;
            }
          }
          else {
            pcVar18 = "dim";
            uVar17 = 0x6bc;
          }
          goto LAB_0016ed4c;
        }
        pFVar13 = fopen(filename,"r");
        if (pFVar13 == (FILE *)0x0) {
          printf("unable to open %s\n",filename);
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x60c,"ref_part_avm","unable to open file");
          uVar10 = 2;
        }
        else {
          iVar9 = 6;
          do {
            pRVar15 = (REF_MPI)fread(&local_669,1,1,pFVar13);
            if (pRVar15 != (REF_MPI)0x1) {
              pcVar18 = "letter";
              pRVar20 = (REF_MPI)0x1;
              uVar17 = 0x60f;
              goto LAB_00170048;
            }
            putchar((int)local_669);
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
          putchar(10);
          pRVar15 = (REF_MPI)fread(&local_5bc,4,1,pFVar13);
          if (pRVar15 == (REF_MPI)0x1) {
            pRVar15 = (REF_MPI)(long)(int)local_5bc;
            printf("%d magic\n",(ulong)local_5bc);
            if (pRVar15 != (REF_MPI)0x1) {
              pcVar18 = "magic";
              pRVar20 = (REF_MPI)0x1;
              uVar17 = 0x615;
              goto LAB_00170048;
            }
            pRVar15 = (REF_MPI)fread(&local_5c0,4,1,pFVar13);
            if (pRVar15 != (REF_MPI)0x1) {
              pcVar18 = "revision";
              pRVar20 = (REF_MPI)0x1;
              uVar17 = 0x616;
              goto LAB_00170048;
            }
            pRVar15 = (REF_MPI)(long)(int)local_5c0;
            printf("%d revision\n",(ulong)local_5c0);
            if (pRVar15 != (REF_MPI)0x2) {
              pcVar18 = "revision";
              pRVar20 = (REF_MPI)0x2;
              uVar17 = 0x618;
              goto LAB_00170048;
            }
            pRVar15 = (REF_MPI)fread(&local_5c4,4,1,pFVar13);
            if (pRVar15 != (REF_MPI)0x1) {
              pcVar18 = "meshes";
              pRVar20 = (REF_MPI)0x1;
              uVar17 = 0x619;
              goto LAB_00170048;
            }
            pRVar15 = (REF_MPI)(long)(int)local_5c4;
            printf("%d meshes\n",(ulong)local_5c4);
            if (pRVar15 != (REF_MPI)0x1) {
              pcVar18 = "meshes";
              pRVar20 = (REF_MPI)0x1;
              uVar17 = 0x61b;
              goto LAB_00170048;
            }
            local_644 = 0x80;
            iVar9 = 0x80;
            do {
              pRVar15 = (REF_MPI)fread(&local_669,1,1,pFVar13);
              if (pRVar15 != (REF_MPI)0x1) {
                pcVar18 = "letter";
                pRVar20 = (REF_MPI)0x1;
                uVar17 = 0x61e;
                goto LAB_00170048;
              }
              putchar((int)local_669);
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
            putchar(10);
            pRVar15 = (REF_MPI)fread(&local_5c8,4,1,pFVar13);
            if (pRVar15 != (REF_MPI)0x1) {
              pcVar18 = "precision";
              pRVar20 = (REF_MPI)0x1;
              uVar17 = 0x622;
              goto LAB_00170048;
            }
            pRVar15 = (REF_MPI)(long)(int)local_5c8;
            printf("%d precision\n",(ulong)local_5c8);
            if (pRVar15 != (REF_MPI)0x2) {
              pcVar18 = "precision";
              pRVar20 = (REF_MPI)0x2;
              uVar17 = 0x624;
              goto LAB_00170048;
            }
            pRVar15 = (REF_MPI)fread(&local_634,4,1,pFVar13);
            uVar10 = local_634;
            if (pRVar15 != (REF_MPI)0x1) {
              pcVar18 = "dim";
              pRVar20 = (REF_MPI)0x1;
              uVar17 = 0x625;
              goto LAB_00170048;
            }
            printf("%d dim\n",(ulong)local_634);
            if ((uVar10 & 0xfffffffe) == 2) {
              pRVar15 = (REF_MPI)fread(&local_644,4,1,pFVar13);
              uVar10 = local_644;
              if (pRVar15 == (REF_MPI)0x1) {
                printf("%d description length\n",(ulong)local_644);
                if (0 < (int)uVar10) {
                  do {
                    pRVar15 = (REF_MPI)fread(&local_669,1,1,pFVar13);
                    if (pRVar15 != (REF_MPI)0x1) {
                      pcVar18 = "letter";
                      pRVar20 = (REF_MPI)0x1;
                      uVar17 = 0x62b;
                      goto LAB_00170048;
                    }
                    putchar((int)local_669);
                    uVar10 = uVar10 - 1;
                  } while (uVar10 != 0);
                }
                putchar(10);
                local_644 = 0x80;
                iVar9 = 0x80;
                do {
                  pRVar15 = (REF_MPI)fread(&local_669,1,1,pFVar13);
                  if (pRVar15 != (REF_MPI)0x1) {
                    pcVar18 = "letter";
                    pRVar20 = (REF_MPI)0x1;
                    uVar17 = 0x632;
                    goto LAB_00170048;
                  }
                  putchar((int)local_669);
                  iVar9 = iVar9 + -1;
                } while (iVar9 != 0);
                putchar(10);
                pRVar15 = (REF_MPI)fread(&local_5d0,1,7,pFVar13);
                if (pRVar15 == (REF_MPI)0x7) {
                  local_5c9 = 0;
                  printf("%s",&local_5d0);
                  iVar9 = strcmp("unstruc",(char *)&local_5d0);
                  if (iVar9 != 0) {
                    pRVar15 = (REF_MPI)(long)iVar9;
                    pcVar18 = "mesh type";
                    uVar17 = 0x639;
                    goto LAB_001704fe;
                  }
                  iVar9 = 0x79;
                  do {
                    pRVar15 = (REF_MPI)fread(&local_669,1,1,pFVar13);
                    if (pRVar15 != (REF_MPI)0x1) {
                      pcVar18 = "letter";
                      pRVar20 = (REF_MPI)0x1;
                      uVar17 = 0x63c;
                      goto LAB_00170048;
                    }
                    putchar((int)local_669);
                    iVar9 = iVar9 + -1;
                  } while (iVar9 != 0);
                  putchar(10);
                  iVar9 = 0x80;
                  do {
                    pRVar15 = (REF_MPI)fread(&local_669,1,1,pFVar13);
                    if (pRVar15 != (REF_MPI)0x1) {
                      pcVar18 = "letter";
                      pRVar20 = (REF_MPI)0x1;
                      uVar17 = 0x643;
                      goto LAB_00170048;
                    }
                    putchar((int)local_669);
                    iVar9 = iVar9 + -1;
                  } while (iVar9 != 0);
                  putchar(10);
                  pRVar15 = (REF_MPI)fread(local_56f,1,6,pFVar13);
                  if (pRVar15 != (REF_MPI)0x6) {
                    pcVar18 = "coordinate_system";
                    pRVar20 = (REF_MPI)0x6;
                    uVar17 = 0x648;
                    goto LAB_00170048;
                  }
                  local_569 = 0;
                  printf("%s",local_56f);
                  uVar10 = ref_grid_parse_coordinate_system(pRVar3,local_56f);
                  if (uVar10 != 0) {
                    pcVar18 = "parse coordinate_system";
                    uVar17 = 0x64c;
                    goto LAB_0016ed4c;
                  }
                  local_644 = 0x7a;
                  iVar9 = 0x7a;
                  do {
                    pRVar15 = (REF_MPI)fread(&local_669,1,1,pFVar13);
                    if (pRVar15 != (REF_MPI)0x1) {
                      pcVar18 = "letter";
                      pRVar20 = (REF_MPI)0x1;
                      uVar17 = 0x64f;
                      goto LAB_00170048;
                    }
                    putchar((int)local_669);
                    iVar9 = iVar9 + -1;
                  } while (iVar9 != 0);
                  putchar(10);
                  pRVar15 = (REF_MPI)fread(&local_550,8,1,pFVar13);
                  if (pRVar15 != (REF_MPI)0x1) {
                    pcVar18 = "model_scale";
                    pRVar20 = (REF_MPI)0x1;
                    uVar17 = 0x653;
                    goto LAB_00170048;
                  }
                  local_668 = local_550;
                  printf("%f model_scale\n");
                  dVar22 = 1.0 - (double)local_668;
                  if (dVar22 <= -dVar22) {
                    dVar22 = -dVar22;
                  }
                  if (1e-12 < dVar22) {
                    printf("%s: %d: %s: %s\nexpected %.15e, was %.15e, %e outside of %e\n",
                           0x3ff0000000000000,local_668,dVar22,0x3d719799812dea11,
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x655,"ref_part_avm","model_scale");
                    goto LAB_0017004f;
                  }
                  pRVar15 = (REF_MPI)fread(local_61f,1,2,pFVar13);
                  if (pRVar15 != (REF_MPI)0x2) {
                    pcVar18 = "units";
                    pRVar20 = (REF_MPI)0x2;
                    uVar17 = 0x656;
                    goto LAB_00170048;
                  }
                  local_61d = 0;
                  printf("%s",local_61f);
                  uVar10 = ref_grid_parse_unit(pRVar3,local_61f);
                  if (uVar10 != 0) {
                    pcVar18 = "parse unit";
                    uVar17 = 0x659;
                    goto LAB_0016ed4c;
                  }
                  iVar9 = 0x7e;
                  do {
                    pRVar15 = (REF_MPI)fread(&local_669,1,1,pFVar13);
                    if (pRVar15 != (REF_MPI)0x1) {
                      pcVar18 = "letter";
                      pRVar20 = (REF_MPI)0x1;
                      uVar17 = 0x65c;
                      goto LAB_00170048;
                    }
                    putchar((int)local_669);
                    iVar9 = iVar9 + -1;
                  } while (iVar9 != 0);
                  putchar(10);
                  pRVar15 = (REF_MPI)fread(local_518,8,7,pFVar13);
                  if (pRVar15 == (REF_MPI)0x7) {
                    uVar19 = 0;
                    do {
                      pRVar3->references[uVar19] = local_518[uVar19];
                      printf("%f reference %d\n",uVar19 & 0xffffffff);
                      uVar19 = uVar19 + 1;
                    } while (uVar19 != 7);
                    iVar9 = 0x80;
                    do {
                      pRVar15 = (REF_MPI)fread(&local_669,1,1,pFVar13);
                      if (pRVar15 != (REF_MPI)0x1) {
                        pcVar18 = "letter";
                        pRVar20 = (REF_MPI)0x1;
                        uVar17 = 0x668;
                        goto LAB_00170048;
                      }
                      putchar((int)local_669);
                      iVar9 = iVar9 + -1;
                    } while (iVar9 != 0);
                    putchar(10);
                    pRVar15 = (REF_MPI)fread(&local_5d4,4,1,pFVar13);
                    if (pRVar15 == (REF_MPI)0x1) {
                      pRVar15 = (REF_MPI)(long)(int)local_5d4;
                      printf("%d refined\n",(ulong)local_5d4);
                      if (pRVar15 != (REF_MPI)0x0) {
                        pcVar18 = "refined";
                        uVar17 = 0x66e;
                        goto LAB_001704fe;
                      }
                      local_644 = 0x80;
                      iVar9 = 0x80;
                      do {
                        pRVar15 = (REF_MPI)fread(&local_669,1,1,pFVar13);
                        if (pRVar15 != (REF_MPI)0x1) {
                          pcVar18 = "letter";
                          pRVar20 = (REF_MPI)0x1;
                          uVar17 = 0x672;
                          goto LAB_00170048;
                        }
                        putchar((int)local_669);
                        iVar9 = iVar9 + -1;
                      } while (iVar9 != 0);
                      putchar(10);
                      pRVar15 = (REF_MPI)fread(&local_5d8,4,1,pFVar13);
                      if (pRVar15 == (REF_MPI)0x1) {
                        pRVar15 = (REF_MPI)fread(&local_5dc,4,1,pFVar13);
                        if (pRVar15 == (REF_MPI)0x1) {
                          pRVar15 = (REF_MPI)fread(&local_5e0,4,1,pFVar13);
                          if (pRVar15 == (REF_MPI)0x1) {
                            printf("%d nnodes %d nfaces %d ncells\n",(ulong)local_5d8,
                                   (ulong)local_5dc,(ulong)local_5e0);
                            pRVar15 = (REF_MPI)fread(&local_5e4,4,1,pFVar13);
                            if (pRVar15 == (REF_MPI)0x1) {
                              pRVar15 = (REF_MPI)fread(&local_5e8,4,1,pFVar13);
                              if (pRVar15 == (REF_MPI)0x1) {
                                pRVar15 = (REF_MPI)fread(&local_5ec,4,1,pFVar13);
                                if (pRVar15 == (REF_MPI)0x1) {
                                  printf("%d max_nodes_per_face %d max_faces_per_face %d max_faces_per_cell\n"
                                         ,(ulong)local_5e4,(ulong)local_5e8,(ulong)local_5ec);
                                  pRVar15 = (REF_MPI)fread(local_5b8,1,0x20,pFVar13);
                                  if (pRVar15 == (REF_MPI)0x20) {
                                    local_598 = 0;
                                    puts((char *)local_5b8);
                                    iVar9 = strcmp("uniform",(char *)local_5b8);
                                    if (iVar9 != 0) {
                                      pRVar15 = (REF_MPI)(long)iVar9;
                                      pcVar18 = "element_scheme";
                                      uVar17 = 0x688;
                                      goto LAB_001704fe;
                                    }
                                    pRVar15 = (REF_MPI)fread(&local_5f0,4,1,pFVar13);
                                    if (pRVar15 == (REF_MPI)0x1) {
                                      pRVar15 = (REF_MPI)fread(&local_5f4,4,1,pFVar13);
                                      if (pRVar15 == (REF_MPI)0x1) {
                                        pRVar15 = (REF_MPI)(long)(int)local_5f0;
                                        local_668 = (REF_MPI)CONCAT44(local_668._4_4_,local_5f4);
                                        printf("%d face_polynomial_order %d cell_polynomial_order\n"
                                               ,(ulong)local_5f0);
                                        if (pRVar15 == (REF_MPI)0x1) {
                                          if ((uint)local_668 == 1) {
                                            pRVar15 = (REF_MPI)fread(&local_5f8,4,1,pFVar13);
                                            if (pRVar15 == (REF_MPI)0x1) {
                                              local_640 = (REF_NODE)
                                                          CONCAT44(local_640._4_4_,local_5f8);
                                              printf("%d boundary_patches\n");
                                              pRVar15 = (REF_MPI)fread(&local_600,4,1,pFVar13);
                                              if (pRVar15 == (REF_MPI)0x1) {
                                                pRVar15 = (REF_MPI)fread(&local_5fc,4,1,pFVar13);
                                                if (pRVar15 == (REF_MPI)0x1) {
                                                  local_668 = (REF_MPI)(long)local_5fc;
                                                  local_630 = local_668;
                                                  pRVar15 = (REF_MPI)fread(&local_604,4,1,pFVar13);
                                                  if (pRVar15 == (REF_MPI)0x1) {
                                                    pRVar15 = (REF_MPI)fread(&local_608,4,1,pFVar13)
                                                    ;
                                                    if (pRVar15 == (REF_MPI)0x1) {
                                                      pRVar15 = (REF_MPI)(long)(int)local_600;
                                                      local_624 = local_604;
                                                      local_650 = (REF_GEOM)
                                                                  CONCAT44(local_650._4_4_,local_608
                                                                          );
                                                      printf("%d nhex %d ntet %d npri %d npyr\n",
                                                             (ulong)local_600,local_668);
                                                      if (pRVar15 == (REF_MPI)0x0) {
                                                        if (local_624 == 0) {
                                                          if ((int)local_650 == 0) {
                                                            if (local_5e0 == (uint)local_668) {
                                                              pRVar15 = (REF_MPI)fread(&local_60c,4,
                                                                                       1,pFVar13);
                                                              if (pRVar15 == (REF_MPI)0x1) {
                                                                local_668 = (REF_MPI)(long)local_60c
                                                                ;
                                                                local_660 = local_668;
                                                                pRVar15 = (REF_MPI)fread(&local_610,
                                                                                         4,1,pFVar13
                                                                                        );
                                                                if (pRVar15 == (REF_MPI)0x1) {
                                                                  pRVar15 = (REF_MPI)fread(&
                                                  local_614,4,1,pFVar13);
                                                  if (pRVar15 == (REF_MPI)0x1) {
                                                    pRVar15 = (REF_MPI)fread(&local_618,4,1,pFVar13)
                                                    ;
                                                    if (pRVar15 == (REF_MPI)0x1) {
                                                      local_650 = (REF_GEOM)
                                                                  CONCAT44(local_650._4_4_,local_610
                                                                          );
                                                      printf("%d ntri %d ntri %d nqua %d nqua\n",
                                                             local_668,(ulong)local_610,
                                                             (ulong)local_614,(ulong)local_618);
                                                      if (local_660 == (REF_MPI)(long)(int)local_650
                                                         ) {
                                                        if (local_614 == 0) {
                                                          if (local_618 == 0) {
                                                            pRVar15 = (REF_MPI)fread(local_568,4,5,
                                                                                     pFVar13);
                                                            if (pRVar15 == (REF_MPI)0x5) {
                                                              lVar21 = 0;
                                                              do {
                                                                pRVar15 = (REF_MPI)(long)*(int *)((
                                                  long)local_568 + lVar21 * 4);
                                                  if (pRVar15 != (REF_MPI)0x0) {
                                                    pcVar18 = "zeros not zero";
                                                    uVar17 = 0x6ae;
                                                    goto LAB_001704fe;
                                                  }
                                                  lVar21 = lVar21 + 1;
                                                  } while (lVar21 != 5);
                                                  lVar21 = (long)(int)local_5d8;
                                                  if (0 < (int)local_640) {
                                                    do {
                                                      pRVar15 = (REF_MPI)fread(local_548,1,0x20,
                                                                               pFVar13);
                                                      if (pRVar15 != (REF_MPI)0x20) {
                                                        pcVar18 = "patch_label";
                                                        uVar17 = 0x6b1;
                                                        pRVar20 = (REF_MPI)0x20;
                                                        goto LAB_00170048;
                                                      }
                                                      local_528 = 0;
                                                      pRVar15 = (REF_MPI)fread(local_588,1,0x10,
                                                                               pFVar13);
                                                      if (pRVar15 != (REF_MPI)0x10) {
                                                        pcVar18 = "patch_type";
                                                        uVar17 = 0x6b3;
                                                        pRVar20 = (REF_MPI)0x10;
                                                        goto LAB_00170048;
                                                      }
                                                      local_578 = 0;
                                                      pRVar15 = (REF_MPI)fread(&local_61c,4,1,
                                                                               pFVar13);
                                                      if (pRVar15 != (REF_MPI)0x1) {
                                                        pcVar18 = "patch_id";
                                                        uVar17 = 0x6b5;
                                                        pRVar20 = (REF_MPI)0x1;
                                                        goto LAB_00170048;
                                                      }
                                                      printf("%s %s %d -> %d\n",local_548,local_588,
                                                             (ulong)local_61c,(ulong)-local_61c);
                                                      iVar9 = (int)local_640 + -1;
                                                      local_640 = (REF_NODE)
                                                                  CONCAT44(local_640._4_4_,iVar9);
                                                    } while (iVar9 != 0);
                                                  }
                                                  goto LAB_0016eed6;
                                                  }
                                                  pcVar18 = "zeros";
                                                  uVar17 = 0x6ac;
                                                  pRVar20 = (REF_MPI)0x5;
                                                  goto LAB_00170048;
                                                  }
                                                  pRVar15 = (REF_MPI)(long)(int)local_618;
                                                  pcVar18 = "nquad mismatch";
                                                  uVar17 = 0x6ab;
                                                  }
                                                  else {
                                                    pRVar15 = (REF_MPI)(long)(int)local_614;
                                                    pcVar18 = "cant do quad";
                                                    uVar17 = 0x6aa;
                                                  }
                                                  goto LAB_001704fe;
                                                  }
                                                  pcVar18 = "ntri mismatch";
                                                  uVar17 = 0x6a9;
                                                  pRVar20 = local_660;
                                                  pRVar15 = (REF_MPI)(long)(int)local_650;
                                                  }
                                                  else {
                                                    pcVar18 = "nqua2";
                                                    pRVar20 = (REF_MPI)0x1;
                                                    uVar17 = 0x6a6;
                                                  }
                                                  }
                                                  else {
                                                    pcVar18 = "nqua";
                                                    pRVar20 = (REF_MPI)0x1;
                                                    uVar17 = 0x6a5;
                                                  }
                                                  }
                                                  else {
                                                    pcVar18 = "ntri2";
                                                    pRVar20 = (REF_MPI)0x1;
                                                    uVar17 = 0x6a4;
                                                  }
                                                  }
                                                  else {
                                                    pcVar18 = "ntri_int";
                                                    pRVar20 = (REF_MPI)0x1;
                                                    uVar17 = 0x6a2;
                                                  }
                                                  }
                                                  else {
                                                    pRVar20 = (REF_MPI)(long)(int)local_5e0;
                                                    pcVar18 = "ncells does not match ntet";
                                                    uVar17 = 0x6a1;
                                                    pRVar15 = local_668;
                                                  }
                                                  goto LAB_00170048;
                                                  }
                                                  pRVar15 = (REF_MPI)(long)(int)local_650;
                                                  pcVar18 = "cant do pyramid";
                                                  uVar17 = 0x6a0;
                                                  }
                                                  else {
                                                    pRVar15 = (REF_MPI)(long)local_624;
                                                    pcVar18 = "cant do prism";
                                                    uVar17 = 0x69f;
                                                  }
                                                  }
                                                  else {
                                                    pcVar18 = "cant do hex";
                                                    uVar17 = 0x69e;
                                                  }
                                                  goto LAB_001704fe;
                                                  }
                                                  pcVar18 = "npyr";
                                                  pRVar20 = (REF_MPI)0x1;
                                                  uVar17 = 0x69b;
                                                  }
                                                  else {
                                                    pcVar18 = "npri";
                                                    pRVar20 = (REF_MPI)0x1;
                                                    uVar17 = 0x69a;
                                                  }
                                                }
                                                else {
                                                  pcVar18 = "ntet_int";
                                                  pRVar20 = (REF_MPI)0x1;
                                                  uVar17 = 0x698;
                                                }
                                              }
                                              else {
                                                pcVar18 = "nhex";
                                                pRVar20 = (REF_MPI)0x1;
                                                uVar17 = 0x697;
                                              }
                                            }
                                            else {
                                              pcVar18 = "boundary_patches";
                                              pRVar20 = (REF_MPI)0x1;
                                              uVar17 = 0x695;
                                            }
                                          }
                                          else {
                                            pRVar15 = (REF_MPI)(long)(int)(uint)local_668;
                                            pcVar18 = "cell_polynomial_order";
                                            pRVar20 = (REF_MPI)0x1;
                                            uVar17 = 0x693;
                                          }
                                        }
                                        else {
                                          pcVar18 = "face_polynomial_order";
                                          pRVar20 = (REF_MPI)0x1;
                                          uVar17 = 0x692;
                                        }
                                      }
                                      else {
                                        pcVar18 = "cell_polynomial_order";
                                        pRVar20 = (REF_MPI)0x1;
                                        uVar17 = 0x68e;
                                      }
                                    }
                                    else {
                                      pcVar18 = "face_polynomial_order";
                                      pRVar20 = (REF_MPI)0x1;
                                      uVar17 = 0x68b;
                                    }
                                  }
                                  else {
                                    pcVar18 = "element_scheme";
                                    pRVar20 = (REF_MPI)0x20;
                                    uVar17 = 0x685;
                                  }
                                }
                                else {
                                  pcVar18 = "max_faces_per_cell";
                                  pRVar20 = (REF_MPI)0x1;
                                  uVar17 = 0x680;
                                }
                              }
                              else {
                                pcVar18 = "max_nodes_per_cell";
                                pRVar20 = (REF_MPI)0x1;
                                uVar17 = 0x67e;
                              }
                            }
                            else {
                              pcVar18 = "max_nodes_per_face";
                              pRVar20 = (REF_MPI)0x1;
                              uVar17 = 0x67c;
                            }
                          }
                          else {
                            pcVar18 = "ncells";
                            pRVar20 = (REF_MPI)0x1;
                            uVar17 = 0x678;
                          }
                        }
                        else {
                          pcVar18 = "nfaces";
                          pRVar20 = (REF_MPI)0x1;
                          uVar17 = 0x677;
                        }
                      }
                      else {
                        pcVar18 = "nnodes";
                        pRVar20 = (REF_MPI)0x1;
                        uVar17 = 0x676;
                      }
                    }
                    else {
                      pcVar18 = "refined";
                      pRVar20 = (REF_MPI)0x1;
                      uVar17 = 0x66c;
                    }
                  }
                  else {
                    pcVar18 = "letter";
                    pRVar20 = (REF_MPI)0x7;
                    uVar17 = 0x660;
                  }
                }
                else {
                  pcVar18 = "letter";
                  pRVar20 = (REF_MPI)0x7;
                  uVar17 = 0x636;
                }
              }
              else {
                pcVar18 = "length";
                pRVar20 = (REF_MPI)0x1;
                uVar17 = 0x628;
              }
              goto LAB_00170048;
            }
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x627,"ref_part_avm","dim");
          }
          else {
            pcVar18 = "magic";
            pRVar20 = (REF_MPI)0x1;
            uVar17 = 0x613;
LAB_00170048:
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   uVar17,"ref_part_avm",pcVar18,pRVar20,pRVar15);
          }
LAB_0017004f:
          uVar10 = 1;
        }
      }
      else {
        pcVar18 = "create grid";
        uVar17 = 0x5ed;
LAB_0016ed4c:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar17,"ref_part_avm",(ulong)uVar10,pcVar18);
      }
      pcVar18 = "avm failed";
      uVar17 = 0xd09;
      goto LAB_0016f3c4;
    }
    local_5b8[0] = 0xffffffffffffffff;
    if (ref_mpi->id == 0) {
      uVar10 = ref_import_meshb_header(filename,(REF_INT *)&local_658,(REF_FILEPOS *)local_518);
      if (uVar10 != 0) {
        pcVar18 = "header";
        uVar17 = 0x2cd;
        goto LAB_0016f399;
      }
      pFVar13 = fopen(filename,"r");
      if (pFVar13 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        pcVar18 = "unable to open file";
        uVar17 = 0x2d2;
LAB_0016f4b5:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar17,"ref_part_meshb",pcVar18);
        uVar10 = 2;
      }
      else {
        uVar10 = ref_import_meshb_jump
                           ((FILE *)pFVar13,(REF_INT)local_658,(REF_FILEPOS *)local_518,3,
                            (REF_BOOL *)&local_660,(REF_FILEPOS *)local_5b8);
        if (uVar10 != 0) {
          pcVar18 = "jump";
          uVar17 = 0x2d5;
          goto LAB_0016f399;
        }
        if ((int)local_660 != 0) {
          sVar12 = fread(&local_630,4,1,pFVar13);
          if (sVar12 == 1) goto LAB_0016ec0c;
          pcVar18 = "dim";
          uVar17 = 0x2d7;
          __size = 1;
          goto LAB_0016f606;
        }
        pcVar18 = "meshb missing dimension";
        uVar17 = 0x2d6;
LAB_0016f702:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar17,"ref_part_meshb",pcVar18);
LAB_0016f709:
        uVar10 = 1;
      }
    }
    else {
      pFVar13 = (FILE *)0x0;
LAB_0016ec0c:
      uVar10 = ref_mpi_bcast(ref_mpi,&local_658,1,1);
      if (uVar10 == 0) {
        uVar10 = ref_mpi_bcast(ref_mpi,&local_630,1,1);
        if (uVar10 != 0) {
          pcVar18 = "bcast";
          uVar17 = 0x2db;
          goto LAB_0016f399;
        }
        uVar10 = ref_grid_create(ref_grid_ptr,ref_mpi);
        if (uVar10 != 0) {
          pcVar18 = "create grid";
          uVar17 = 0x2dc;
          goto LAB_0016f399;
        }
        pRVar3 = *ref_grid_ptr;
        pRVar4 = pRVar3->node;
        pRVar5 = pRVar3->geom;
        pRVar3->twod = (uint)((int)local_630 == 2);
        if (pRVar3->mpi->id != 0) {
LAB_0016f565:
          uVar10 = ref_mpi_bcast(ref_mpi,local_548,1,2);
          if (uVar10 == 0) {
            uVar10 = ref_part_node((FILE *)pFVar13,0,(REF_INT)local_658,pRVar3->twod,pRVar4,
                                   local_548[0]);
            __size = local_5b8[0];
            if (uVar10 == 0) {
              local_668 = ref_mpi;
              local_640 = pRVar4;
              if ((pRVar3->mpi->id == 0) && (sVar12 = ftello(pFVar13), __size != sVar12)) {
                pcVar18 = "vertex file location";
                uVar17 = 0x2ef;
                goto LAB_0016f606;
              }
              lVar21 = 2;
              local_650 = pRVar5;
              do {
                pRVar6 = pRVar3->cell[lVar21 + -2];
                if (pRVar3->mpi->id == 0) {
                  uVar10 = ref_cell_meshb_keyword(pRVar6,&local_5d0);
                  if (uVar10 != 0) {
                    pcVar18 = "kw";
                    uVar17 = 0x2f3;
                    goto LAB_0016f399;
                  }
                  uVar10 = ref_import_meshb_jump
                                     ((FILE *)pFVar13,(REF_INT)local_658,(REF_FILEPOS *)local_518,
                                      local_5d0,(REF_BOOL *)&local_660,(REF_FILEPOS *)local_5b8);
                  if (uVar10 != 0) {
                    pcVar18 = "jump";
                    uVar17 = 0x2f6;
                    goto LAB_0016f399;
                  }
                  if ((int)local_660 != 0) {
                    RVar11 = ref_part_meshb_long((FILE *)pFVar13,(REF_INT)local_658,local_568);
                    if (RVar11 != 0) {
                      pcVar18 = "ncell";
                      uVar17 = 0x2f8;
                      goto LAB_0016f829;
                    }
                  }
                }
                uVar10 = ref_mpi_bcast(local_668,&local_660,1,1);
                if (uVar10 != 0) {
                  pcVar18 = "bcast";
                  uVar17 = 0x2fc;
                  goto LAB_0016f399;
                }
                if ((int)local_660 != 0) {
                  uVar10 = ref_mpi_bcast(local_668,local_568,1,2);
                  if (uVar10 != 0) {
                    pcVar18 = "bcast";
                    uVar17 = 0x2fe;
                    goto LAB_0016f399;
                  }
                  uVar10 = ref_part_meshb_cell(pRVar6,local_568[0],local_640,local_548[0],
                                               (REF_INT)local_658,0,(FILE *)pFVar13);
                  __size = local_5b8[0];
                  if (uVar10 != 0) {
                    pcVar18 = "part cell";
                    uVar17 = 0x301;
                    goto LAB_0016f399;
                  }
                  if ((pRVar3->mpi->id == 0) && (sVar12 = ftello(pFVar13), __size != sVar12)) {
                    pcVar18 = "cell file location";
                    uVar17 = 0x303;
                    goto LAB_0016f606;
                  }
                }
                pRVar4 = local_640;
                lVar21 = lVar21 + 1;
              } while (lVar21 != 0x12);
              iVar9 = 0;
              do {
                if (pRVar3->mpi->id == 0) {
                  uVar10 = ref_import_meshb_jump
                                     ((FILE *)pFVar13,(REF_INT)local_658,(REF_FILEPOS *)local_518,
                                      iVar9 + 0x28,(REF_BOOL *)&local_660,(REF_FILEPOS *)local_5b8);
                  if (uVar10 != 0) {
                    pcVar18 = "jump";
                    uVar17 = 0x30c;
                    goto LAB_0016f399;
                  }
                  if ((int)local_660 != 0) {
                    RVar11 = ref_part_meshb_long((FILE *)pFVar13,(REF_INT)local_658,local_588);
                    if (RVar11 != 0) {
                      pcVar18 = "ngeom";
                      uVar17 = 0x30e;
                      goto LAB_0016f829;
                    }
                  }
                }
                uVar10 = ref_mpi_bcast(local_668,&local_660,1,1);
                if (uVar10 != 0) {
                  pcVar18 = "bcast";
                  uVar17 = 0x312;
                  goto LAB_0016f399;
                }
                if ((int)local_660 != 0) {
                  uVar10 = ref_mpi_bcast(local_668,local_588,1,2);
                  if (uVar10 != 0) {
                    pcVar18 = "bcast";
                    uVar17 = 0x314;
                    goto LAB_0016f399;
                  }
                  uVar10 = ref_part_meshb_geom_bcast
                                     (local_650,local_588[0],iVar9,pRVar4,(REF_INT)local_658,
                                      (FILE *)pFVar13);
                  __size = local_5b8[0];
                  if (uVar10 != 0) {
                    pcVar18 = "part geom";
                    uVar17 = 0x317;
                    goto LAB_0016f399;
                  }
                  if ((pRVar3->mpi->id == 0) && (sVar12 = ftello(pFVar13), __size != sVar12)) {
                    pcVar18 = "end location";
                    uVar17 = 0x319;
                    goto LAB_0016f606;
                  }
                }
                iVar9 = iVar9 + 1;
              } while (iVar9 != 3);
              if (pRVar3->mpi->id == 0) {
                uVar10 = ref_import_meshb_jump
                                   ((FILE *)pFVar13,(REF_INT)local_658,(REF_FILEPOS *)local_518,0x7e
                                    ,(REF_BOOL *)&local_660,(REF_FILEPOS *)local_5b8);
                if (uVar10 != 0) {
                  pcVar18 = "jump";
                  uVar17 = 0x321;
                  goto LAB_0016f399;
                }
                if ((int)local_660 != 0) {
                  RVar11 = ref_part_meshb_size((FILE *)pFVar13,(REF_INT)local_658,
                                               &local_650->cad_data_size);
                  if (RVar11 != 0) {
                    pcVar18 = "cad data size";
                    uVar17 = 0x325;
                    goto LAB_0016f829;
                  }
                  if (local_650->cad_data != (REF_BYTE *)0x0) {
                    free(local_650->cad_data);
                  }
                  pRVar5 = local_650;
                  __size = local_650->cad_data_size;
                  pRVar14 = (REF_BYTE *)malloc(__size);
                  pRVar5->cad_data = pRVar14;
                  if (pRVar14 == (REF_BYTE *)0x0) {
                    pcVar18 = "malloc ref_geom_cad_data(ref_geom) of REF_BYTE NULL";
                    uVar17 = 0x32b;
                    goto LAB_0016f4b5;
                  }
                  sVar12 = fread(pRVar14,1,__size,pFVar13);
                  sVar8 = local_5b8[0];
                  if (__size == sVar12) {
                    sVar12 = ftello(pFVar13);
                    if (sVar8 == sVar12) goto LAB_0016fb17;
                    pcVar18 = "end location";
                    uVar17 = 0x330;
                    __size = sVar8;
                  }
                  else {
                    pcVar18 = "cad_data";
                    uVar17 = 0x32f;
                  }
LAB_0016f606:
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,uVar17,"ref_part_meshb",pcVar18,__size,sVar12);
                  goto LAB_0016f709;
                }
              }
LAB_0016fb17:
              uVar10 = ref_mpi_bcast(local_668,&local_660,1,1);
              if (uVar10 == 0) {
                if ((int)local_660 == 0) {
LAB_00170577:
                  uVar10 = ref_geom_ghost(local_650,local_640);
                  if (uVar10 == 0) {
                    uVar10 = ref_node_ghost_real(local_640);
                    if (uVar10 == 0) {
                      uVar10 = ref_grid_inward_boundary_orientation(pRVar3);
                      if (uVar10 == 0) {
                        if (pRVar3->mpi->id == 0) {
                          fclose(pFVar13);
                        }
                        return 0;
                      }
                      pcVar18 = "inward boundary orientation";
                      uVar17 = 0x347;
                    }
                    else {
                      pcVar18 = "ghost real";
                      uVar17 = 0x344;
                    }
                  }
                  else {
                    pcVar18 = "fill geom ghosts";
                    uVar17 = 0x343;
                  }
                }
                else {
                  data = &local_650->cad_data_size;
                  uVar10 = ref_mpi_bcast(local_668,data,1,2);
                  if (uVar10 == 0) {
                    pRVar14 = local_650->cad_data;
                    if (pRVar3->mpi->id == 0) {
                      sVar12 = *data;
                    }
                    else {
                      if (pRVar14 != (REF_BYTE *)0x0) {
                        free(pRVar14);
                      }
                      pRVar5 = local_650;
                      sVar12 = local_650->cad_data_size;
                      pRVar14 = (REF_BYTE *)malloc(sVar12);
                      pRVar5->cad_data = pRVar14;
                      if (pRVar14 == (REF_BYTE *)0x0) {
                        pcVar18 = "malloc ref_geom_cad_data(ref_geom) of REF_BYTE NULL";
                        uVar17 = 0x33c;
                        goto LAB_0016f4b5;
                      }
                    }
                    uVar10 = ref_mpi_bcast(local_668,pRVar14,(REF_INT)sVar12,4);
                    if (uVar10 == 0) goto LAB_00170577;
                    pcVar18 = "bcast";
                    uVar17 = 0x340;
                  }
                  else {
                    pcVar18 = "bcast";
                    uVar17 = 0x337;
                  }
                }
              }
              else {
                pcVar18 = "bcast";
                uVar17 = 0x333;
              }
            }
            else {
              pcVar18 = "part node";
              uVar17 = 0x2ed;
            }
          }
          else {
            pcVar18 = "bcast";
            uVar17 = 0x2ea;
          }
          goto LAB_0016f399;
        }
        uVar10 = ref_import_meshb_jump
                           ((FILE *)pFVar13,(REF_INT)local_658,(REF_FILEPOS *)local_518,4,
                            (REF_BOOL *)&local_660,(REF_FILEPOS *)local_5b8);
        if (uVar10 != 0) {
          pcVar18 = "jump";
          uVar17 = 0x2e5;
          goto LAB_0016f399;
        }
        if ((int)local_660 == 0) {
          pcVar18 = "meshb missing vertex";
          uVar17 = 0x2e6;
          goto LAB_0016f702;
        }
        RVar11 = ref_part_meshb_long((FILE *)pFVar13,(REF_INT)local_658,local_548);
        if (RVar11 == 0) goto LAB_0016f565;
        pcVar18 = "nnode";
        uVar17 = 0x2e7;
LAB_0016f829:
        uVar10 = 1;
        uVar19 = 1;
      }
      else {
        pcVar18 = "bcast";
        uVar17 = 0x2da;
LAB_0016f399:
        uVar19 = (ulong)uVar10;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar17
             ,"ref_part_meshb",uVar19,pcVar18);
    }
    pcVar18 = "meshb failed";
    uVar17 = 0xd05;
  }
  else {
    pcVar18 = filename + (sVar12 - 10);
    iVar9 = strcmp(pcVar18,".lb8.ugrid");
    if (iVar9 == 0) {
      uVar10 = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,0,0);
      if (uVar10 == 0) {
        return 0;
      }
      pcVar18 = "lb8_ugrid failed";
      uVar17 = 0xcdf;
      goto LAB_0016ec93;
    }
    iVar9 = strcmp(filename + (sVar12 - 9),".b8.ugrid");
    if (iVar9 == 0) {
LAB_0016eb85:
      uVar10 = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,1,0);
      if (uVar10 == 0) {
        return 0;
      }
      pcVar18 = "b8_ugrid failed";
      uVar17 = 0xce6;
LAB_0016ec93:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar17
             ,"ref_part_by_extension",(ulong)uVar10,pcVar18);
      return uVar10;
    }
    if (sVar12 == 0xb) {
      iVar9 = strcmp(pcVar18,".b8l.ugrid");
      if (iVar9 != 0) goto LAB_0016ebd7;
LAB_0016ee33:
      uVar10 = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,1,1);
      if (uVar10 == 0) {
        return 0;
      }
      pcVar18 = "b8_ugrid failed";
      uVar17 = 0xcf3;
    }
    else {
      local_668 = (REF_MPI)(filename + (sVar12 - 0xb));
      iVar9 = strcmp((char *)local_668,".lb8l.ugrid");
      if (iVar9 == 0) {
        uVar10 = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,0,1);
        if (uVar10 == 0) {
          return 0;
        }
        pcVar18 = "lb8_ugrid failed";
        uVar17 = 0xced;
        goto LAB_0016ec93;
      }
      iVar9 = strcmp(pcVar18,".b8l.ugrid");
      if (iVar9 == 0) goto LAB_0016ee33;
      if ((0xc < sVar12) && (iVar9 = strcmp(filename + (sVar12 - 0xc),".lb8.ugrid64"), iVar9 == 0))
      {
        uVar10 = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,0,1);
        if (uVar10 == 0) {
          return 0;
        }
        pcVar18 = "lb8_ugrid failed";
        uVar17 = 0xcfa;
        goto LAB_0016ec93;
      }
      iVar9 = strcmp((char *)local_668,".b8.ugrid64");
      if (iVar9 != 0) goto LAB_0016ebd7;
      uVar10 = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,1,1);
      if (uVar10 == 0) {
        return 0;
      }
      pcVar18 = "b8_ugrid failed";
      uVar17 = 0xd00;
    }
  }
LAB_0016f3c4:
  uVar19 = (ulong)uVar10;
LAB_0016f3c7:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar17,
         "ref_part_by_extension",uVar19,pcVar18);
  return uVar10;
}

Assistant:

REF_FCN REF_STATUS ref_part_by_extension(REF_GRID *ref_grid_ptr,
                                         REF_MPI ref_mpi,
                                         const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], ".lb8.ugrid") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                           REF_FALSE),
        "lb8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 9 &&
      strcmp(&filename[end_of_string - 9], ".b8.ugrid") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE,
                           REF_FALSE),
        "b8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 11 &&
      strcmp(&filename[end_of_string - 11], ".lb8l.ugrid") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                           REF_TRUE),
        "lb8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], ".b8l.ugrid") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE, REF_TRUE),
        "b8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 12 &&
      strcmp(&filename[end_of_string - 12], ".lb8.ugrid64") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                           REF_TRUE),
        "lb8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 11 &&
      strcmp(&filename[end_of_string - 11], ".b8.ugrid64") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE, REF_TRUE),
        "b8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 6 &&
      strcmp(&filename[end_of_string - 6], ".meshb") == 0) {
    RSS(ref_part_meshb(ref_grid_ptr, ref_mpi, filename), "meshb failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".avm") == 0) {
    RSS(ref_part_avm(ref_grid_ptr, ref_mpi, filename), "avm failed");
    return REF_SUCCESS;
  }
  printf("%s: %d: %s %s\n", __FILE__, __LINE__,
         "input file name extension unknown", filename);
  RSS(REF_FAILURE, "unknown file extension");
  return REF_FAILURE;
}